

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
visit_key(basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_> *this
         ,string_view_type *name,ser_context *param_3,error_code *param_4)

{
  bool bVar1;
  reference this_00;
  size_t sVar2;
  const_pointer pvVar3;
  stream_sink<char> *this_01;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  long in_RDI;
  stream_sink<char> *in_stack_00000088;
  bool in_stack_00000096;
  bool in_stack_00000097;
  size_t in_stack_00000098;
  char *in_stack_000000a0;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  undefined8 in_stack_ffffffffffffffc8;
  char cVar4;
  stream_sink<char> *in_stack_ffffffffffffffd0;
  
  cVar4 = (char)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  bVar1 = std::
          vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
          ::empty((vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
                   *)in_stack_ffffffffffffffd0);
  if (!bVar1) {
    this_00 = std::
              vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
              ::back((vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
                      *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0));
    sVar2 = encoding_context::count(this_00);
    if (sVar2 != 0) {
      stream_sink<char>::push_back(in_stack_ffffffffffffffd0,cVar4);
    }
  }
  stream_sink<char>::push_back(in_stack_ffffffffffffffd0,cVar4);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
  cVar4 = (char)((ulong)pvVar3 >> 0x38);
  this_01 = (stream_sink<char> *)
            std::basic_string_view<char,_std::char_traits<char>_>::length(in_RSI);
  basic_json_encode_options<char>::escape_all_non_ascii
            ((basic_json_encode_options<char> *)(in_RDI + 0x40));
  basic_json_encode_options<char>::escape_solidus
            ((basic_json_encode_options<char> *)(in_RDI + 0x40));
  detail::escape_string<char,jsoncons::stream_sink<char>>
            (in_stack_000000a0,in_stack_00000098,in_stack_00000097,in_stack_00000096,
             in_stack_00000088);
  stream_sink<char>::push_back(this_01,cVar4);
  stream_sink<char>::push_back(this_01,cVar4);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_key(const string_view_type& name, const ser_context&, std::error_code&) final
        {
            if (!stack_.empty() && stack_.back().count() > 0)
            {
                sink_.push_back(',');
            }

            sink_.push_back('\"');
            jsoncons::detail::escape_string(name.data(), name.length(),options_.escape_all_non_ascii(),options_.escape_solidus(),sink_);
            sink_.push_back('\"');
            sink_.push_back(':');
            JSONCONS_VISITOR_RETURN;
        }